

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astBreakNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_stackFrameRecord_t *targetRecord;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sVar1 = sysbvm_environment_lookBreakTargetRecursively(context,arguments[1]);
  if (sVar1 == 0) {
    sysbvm_error("No target available for break.");
  }
  else if ((sVar1 & 0xf) == 0) {
    targetRecord = *(sysbvm_stackFrameRecord_t **)(sVar1 + 0x10);
    goto LAB_0011d2ec;
  }
  targetRecord = (sysbvm_stackFrameRecord_t *)((long)sVar1 >> 4);
LAB_0011d2ec:
  sysbvm_stackFrame_breakInto(targetRecord);
  return 0;
}

Assistant:

static sysbvm_tuple_t sysbvm_astBreakNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astBreakNode_t **breakNode = (sysbvm_astBreakNode_t**)node;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*breakNode)->super.sourcePosition);

    sysbvm_tuple_t breakTarget = sysbvm_environment_lookBreakTargetRecursively(context, *environment);
    if(!breakTarget)
        sysbvm_error("No target available for break.");

    sysbvm_stackFrame_breakInto((sysbvm_stackFrameRecord_t*)sysbvm_tuple_uintptr_decode(breakTarget));
    return SYSBVM_NULL_TUPLE;
}